

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void * Malloc(size_t size)

{
  MemInfo *pMVar1;
  size_t in_RDI;
  MemInfo *point;
  char *alloc;
  MemInfo *local_8;
  
  pMVar1 = (MemInfo *)malloc(in_RDI + 0x18);
  if (pMVar1 == (MemInfo *)0x0) {
    local_8 = (MemInfo *)0x0;
  }
  else {
    pMVar1->prev = MallocKey;
    pMVar1->next = (MemInfo *)0x0;
    pMVar1->size = in_RDI;
    if (MallocKey != (MemInfo *)0x0) {
      pMVar1->prev->next = pMVar1;
    }
    local_8 = pMVar1 + 1;
    MallocKey = pMVar1;
  }
  return local_8;
}

Assistant:

void *Malloc(size_t size)
{
  char *alloc = NULL;
  struct MemInfo *point;

#ifdef DEBUG
  size+=MEMORY_COOKIE; /* add extra bytes after the block! */
#endif

#ifdef AMIGA
  alloc=(char *)AllocMem(size+sizeof(struct MemInfo), 0L);
#elif defined(unix)
  alloc=(char *)malloc(size+sizeof(struct MemInfo));
#endif

  if(!alloc)
    return(NULL);

  point=(struct MemInfo *)alloc;
  point->prev=MallocKey;	 /* previous */
  point->next=NULL;		 /* next */
  point->size=size;		 /* size */
#ifdef DEBUG
  malloc_count++;
  mem+=size+sizeof(struct MemInfo);
  if(mem>maxmem)
    maxmem=mem;

  memset((void *)((char *)point+sizeof(struct MemInfo)), 0xbb, size);
#endif
  if(MallocKey)
    point->prev->next=point;

  MallocKey = (void *)point;

  alloc = ((char *)point+sizeof(struct MemInfo));
  return ((void *)alloc);
}